

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O2

size_t cmCTestSubmitHandlerWriteMemoryCallback(void *ptr,size_t size,size_t nmemb,void *data)

{
  size_t sVar1;
  
  sVar1 = (size_t)((int)size * (int)nmemb);
  cm::append<std::vector<char,_std::allocator<char>_>,_const_char_*,_0>
            ((vector<char,_std::allocator<char>_> *)data,(char *)ptr,(char *)((long)ptr + sVar1));
  return sVar1;
}

Assistant:

static size_t cmCTestSubmitHandlerWriteMemoryCallback(void* ptr, size_t size,
                                                      size_t nmemb, void* data)
{
  int realsize = static_cast<int>(size * nmemb);
  const char* chPtr = static_cast<char*>(ptr);
  cm::append(*static_cast<cmCTestSubmitHandlerVectorOfChar*>(data), chPtr,
             chPtr + realsize);
  return realsize;
}